

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O2

OperatorResultType __thiscall
duckdb::PhysicalNestedLoopJoin::ResolveComplexJoin
          (PhysicalNestedLoopJoin *this,ExecutionContext *context,DataChunk *input,DataChunk *chunk,
          OperatorState *state_p)

{
  DataChunk *this_00;
  OperatorState *lpos;
  ColumnDataCollection *this_01;
  ColumnDataScanState *state;
  DataChunk *result;
  __pthread_list_t *this_02;
  ColumnDataScanState *state_00;
  DataChunk *result_00;
  OuterJoinMarker *this_03;
  bool bVar1;
  pointer pGVar2;
  idx_t count;
  InternalException *pIVar3;
  SelectionVector lvector;
  SelectionVector rvector;
  
  pGVar2 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                       super_CachingPhysicalOperator.super_PhysicalOperator.sink_state);
  lpos = state_p + 0x44;
  this_01 = (ColumnDataCollection *)
            &pGVar2[2].super_StateWithBlockableTasks.blocked_tasks.
             super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  state = (ColumnDataScanState *)(state_p + 0x14);
  result = (DataChunk *)(state_p + 0x34);
  this_02 = &pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list;
  state_00 = (ColumnDataScanState *)(state_p + 0x24);
  result_00 = (DataChunk *)(state_p + 0x3c);
  this_00 = (DataChunk *)(state_p + 3);
  this_03 = (OuterJoinMarker *)(state_p + 0x46);
  do {
    if (*(char *)((long)&state_p[2]._vptr_OperatorState + 3) == '\x01') {
      *(undefined1 *)((long)&state_p[2]._vptr_OperatorState + 3) = 0;
      lpos->_vptr_OperatorState = (_func_int **)0x0;
      state_p[0x45]._vptr_OperatorState = (_func_int **)0x0;
      bVar1 = ColumnDataCollection::Scan(this_01,state,result);
      if (!bVar1) {
        *(undefined1 *)((long)&state_p[2]._vptr_OperatorState + 2) = 1;
        if ((*(char *)&state_p[0x46]._vptr_OperatorState == '\x01') &&
           (OuterJoinMarker::ConstructLeftJoinResult(this_03,input,chunk), this_03->enabled == true)
           ) {
          switchD_0049f7f1::default
                    (state_p[0x47]._vptr_OperatorState,0,(size_t)state_p[0x48]._vptr_OperatorState);
          return NEED_MORE_INPUT;
        }
        return NEED_MORE_INPUT;
      }
      bVar1 = ColumnDataCollection::Scan((ColumnDataCollection *)this_02,state_00,result_00);
      if (!bVar1) {
        pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&lvector,"Nested loop join: payload and conditions are unaligned!?",
                   (allocator *)&rvector);
        InternalException::InternalException(pIVar3,(string *)&lvector);
        __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (state_p[0x37]._vptr_OperatorState != state_p[0x3f]._vptr_OperatorState) {
        pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&lvector,"Nested loop join: payload and conditions are unaligned!?",
                   (allocator *)&rvector);
        InternalException::InternalException(pIVar3,(string *)&lvector);
        __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    if (*(char *)((long)&state_p[2]._vptr_OperatorState + 2) == '\x01') {
      DataChunk::Reset(this_00);
      ExpressionExecutor::Execute((ExpressionExecutor *)(state_p + 0xb),input,this_00);
      lpos->_vptr_OperatorState = (_func_int **)0x0;
      state_p[0x45]._vptr_OperatorState = (_func_int **)0x0;
      ColumnDataCollection::InitializeScan(this_01,state,ALLOW_ZERO_COPY);
      ColumnDataCollection::Scan(this_01,state,result);
      ColumnDataCollection::InitializeScan((ColumnDataCollection *)this_02,state_00,ALLOW_ZERO_COPY)
      ;
      ColumnDataCollection::Scan((ColumnDataCollection *)this_02,state_00,result_00);
      *(undefined1 *)((long)&state_p[2]._vptr_OperatorState + 2) = 0;
    }
    DataChunk::Verify(input);
    DataChunk::Verify(result);
    DataChunk::Verify(result_00);
    SelectionVector::SelectionVector(&lvector,0x800);
    SelectionVector::SelectionVector(&rvector,0x800);
    count = NestedLoopJoinInner::Perform
                      ((idx_t *)lpos,(idx_t *)(state_p + 0x45),this_00,result,&lvector,&rvector,
                       &(this->super_PhysicalComparisonJoin).conditions);
    if (count != 0) {
      OuterJoinMarker::SetMatches(this_03,&lvector,count,0);
      OuterJoinMarker::SetMatches
                ((OuterJoinMarker *)&pGVar2[4].super_StateWithBlockableTasks,&rvector,count,
                 (idx_t)state_p[0x1e]._vptr_OperatorState);
      DataChunk::Slice(chunk,input,&lvector,count,0);
      DataChunk::Slice(chunk,result_00,&rvector,count,
                       ((long)(input->data).
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(input->data).
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x68);
    }
    if (state_p[0x37]._vptr_OperatorState <= state_p[0x45]._vptr_OperatorState) {
      *(undefined1 *)((long)&state_p[2]._vptr_OperatorState + 3) = 1;
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rvector.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&lvector.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (count != 0) {
      return HAVE_MORE_OUTPUT;
    }
  } while( true );
}

Assistant:

OperatorResultType PhysicalNestedLoopJoin::ResolveComplexJoin(ExecutionContext &context, DataChunk &input,
                                                              DataChunk &chunk, OperatorState &state_p) const {
	auto &state = state_p.Cast<PhysicalNestedLoopJoinState>();
	auto &gstate = sink_state->Cast<NestedLoopJoinGlobalState>();

	idx_t match_count;
	do {
		if (state.fetch_next_right) {
			// we exhausted the chunk on the right: move to the next chunk on the right
			state.left_tuple = 0;
			state.right_tuple = 0;
			state.fetch_next_right = false;
			// check if we exhausted all chunks on the RHS
			if (gstate.right_condition_data.Scan(state.condition_scan_state, state.right_condition)) {
				if (!gstate.right_payload_data.Scan(state.payload_scan_state, state.right_payload)) {
					throw InternalException("Nested loop join: payload and conditions are unaligned!?");
				}
				if (state.right_condition.size() != state.right_payload.size()) {
					throw InternalException("Nested loop join: payload and conditions are unaligned!?");
				}
			} else {
				// we exhausted all chunks on the right: move to the next chunk on the left
				state.fetch_next_left = true;
				if (state.left_outer.Enabled()) {
					// left join: before we move to the next chunk, see if we need to output any vectors that didn't
					// have a match found
					state.left_outer.ConstructLeftJoinResult(input, chunk);
					state.left_outer.Reset();
				}
				return OperatorResultType::NEED_MORE_INPUT;
			}
		}
		if (state.fetch_next_left) {
			// resolve the left join condition for the current chunk
			state.left_condition.Reset();
			state.lhs_executor.Execute(input, state.left_condition);

			state.left_tuple = 0;
			state.right_tuple = 0;
			gstate.right_condition_data.InitializeScan(state.condition_scan_state);
			gstate.right_condition_data.Scan(state.condition_scan_state, state.right_condition);

			gstate.right_payload_data.InitializeScan(state.payload_scan_state);
			gstate.right_payload_data.Scan(state.payload_scan_state, state.right_payload);
			state.fetch_next_left = false;
		}
		// now we have a left and a right chunk that we can join together
		// note that we only get here in the case of a LEFT, INNER or FULL join
		auto &left_chunk = input;
		auto &right_condition = state.right_condition;
		auto &right_payload = state.right_payload;

		// sanity check
		left_chunk.Verify();
		right_condition.Verify();
		right_payload.Verify();

		// now perform the join
		SelectionVector lvector(STANDARD_VECTOR_SIZE), rvector(STANDARD_VECTOR_SIZE);
		match_count = NestedLoopJoinInner::Perform(state.left_tuple, state.right_tuple, state.left_condition,
		                                           right_condition, lvector, rvector, conditions);
		// we have finished resolving the join conditions
		if (match_count > 0) {
			// we have matching tuples!
			// construct the result
			state.left_outer.SetMatches(lvector, match_count);
			gstate.right_outer.SetMatches(rvector, match_count, state.condition_scan_state.current_row_index);

			chunk.Slice(input, lvector, match_count);
			chunk.Slice(right_payload, rvector, match_count, input.ColumnCount());
		}

		// check if we exhausted the RHS, if we did we need to move to the next right chunk in the next iteration
		if (state.right_tuple >= right_condition.size()) {
			state.fetch_next_right = true;
		}
	} while (match_count == 0);
	return OperatorResultType::HAVE_MORE_OUTPUT;
}